

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O2

int __thiscall
Vgm_Emu_Impl::play_frame(Vgm_Emu_Impl *this,blip_time_t blip_time,int sample_count,sample_t *buf)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int end_time;
  ulong uVar4;
  
  lVar3 = (long)this->fm_time_factor;
  iVar1 = (int)(((long)(sample_count >> 1) << 0xc) / lVar3);
  end_time = iVar1 + -2;
  uVar2 = (iVar1 + -1) * lVar3 + this->fm_time_offset;
  do {
    uVar4 = uVar2 >> 0xc;
    end_time = end_time + 1;
    uVar2 = uVar2 + lVar3;
    iVar1 = (int)uVar4;
  } while (iVar1 < sample_count >> 1);
  if ((this->ym2612).last_time == -1) {
    if ((this->ym2413).last_time != -1) {
      (this->ym2413).out = buf;
      (this->ym2413).last_time = 0;
    }
  }
  else {
    (this->ym2612).out = buf;
    (this->ym2612).last_time = 0;
    memset(buf,0,(long)(iVar1 * 2) * 2);
  }
  run_commands(this,end_time);
  Ym_Emu<Ym2612_Emu>::run_until(&this->ym2612,iVar1);
  Ym_Emu<Ym2413_Emu>::run_until(&this->ym2413,iVar1);
  this->fm_time_offset =
       this->fm_time_offset + (long)iVar1 * -0x1000 + (long)end_time * (long)this->fm_time_factor;
  Sms_Apu::end_frame(&this->psg,blip_time);
  return iVar1 * 2;
}

Assistant:

int Vgm_Emu_Impl::play_frame( blip_time_t blip_time, int sample_count, sample_t* buf )
{
	// to do: timing is working mostly by luck
	
	int min_pairs = sample_count >> 1;
	int vgm_time = ((long) min_pairs << fm_time_bits) / fm_time_factor - 1;
	assert( to_fm_time( vgm_time ) <= min_pairs );
	int pairs = min_pairs;
	while ( (pairs = to_fm_time( vgm_time )) < min_pairs )
		vgm_time++;
	//debug_printf( "pairs: %d, min_pairs: %d\n", pairs, min_pairs );
	
	if ( ym2612.enabled() )
	{
		ym2612.begin_frame( buf );
		memset( buf, 0, pairs * stereo * sizeof *buf );
	}
	else if ( ym2413.enabled() )
	{
		ym2413.begin_frame( buf );
	}
	
	run_commands( vgm_time );
	ym2612.run_until( pairs );
	ym2413.run_until( pairs );
	
	fm_time_offset = (vgm_time * fm_time_factor + fm_time_offset) -
			((long) pairs << fm_time_bits);
	
	psg.end_frame( blip_time );
	
	return pairs * stereo;
}